

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapUniq.c
# Opt level: O2

int ** Amap_LibLookupTableAlloc(Vec_Ptr_t *vVec,int fVerbose)

{
  uint uVar1;
  void *pvVar2;
  int **ppiVar3;
  Vec_Int_t *p;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  
  iVar7 = vVec->nSize;
  lVar6 = (long)iVar7;
  iVar8 = iVar7;
  for (iVar4 = 0; iVar4 < iVar7; iVar4 = iVar4 + 1) {
    pvVar2 = Vec_PtrEntry(vVec,iVar4);
    iVar8 = iVar8 + *(int *)((long)pvVar2 + 4);
    iVar7 = vVec->nSize;
  }
  ppiVar3 = (int **)malloc(((long)iVar8 + lVar6 * 8) * 4);
  *ppiVar3 = (int *)(ppiVar3 + lVar6 * 4);
  iVar4 = 0;
  for (uVar5 = 0; (long)uVar5 < (long)iVar7; uVar5 = uVar5 + 1) {
    p = (Vec_Int_t *)Vec_PtrEntry(vVec,(int)uVar5);
    ppiVar3[uVar5] = *ppiVar3 + iVar4;
    iVar7 = p->nSize;
    if (fVerbose != 0) {
      printf("%d : ",uVar5 & 0xffffffff);
    }
    iVar4 = iVar4 + iVar7 + 1;
    for (lVar6 = 0; lVar6 < p->nSize; lVar6 = lVar6 + 1) {
      uVar1 = Vec_IntEntry(p,(int)lVar6);
      ppiVar3[uVar5][lVar6] = uVar1;
      if (fVerbose != 0) {
        printf("%d(%d) ",(ulong)(uVar1 & 0xffff),(ulong)(uint)((int)uVar1 >> 0x10));
      }
    }
    if (fVerbose != 0) {
      putchar(10);
    }
    ppiVar3[uVar5][lVar6] = 0;
    iVar7 = vVec->nSize;
  }
  if (iVar4 == iVar8) {
    return ppiVar3;
  }
  __assert_fail("nTotal == nEntries",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/amap/amapUniq.c"
                ,0x133,"int **Amap_LibLookupTableAlloc(Vec_Ptr_t *, int)");
}

Assistant:

int ** Amap_LibLookupTableAlloc( Vec_Ptr_t * vVec, int fVerbose )
{
    Vec_Int_t * vOne;
    int ** pRes, * pBuffer;
    int i, k, nTotal, nSize, nEntries, Value;
    // count the total size
    nEntries = nSize = Vec_PtrSize( vVec );
    Vec_PtrForEachEntry( Vec_Int_t *, vVec, vOne, i )
        nEntries += Vec_IntSize(vOne);
    pBuffer = ABC_ALLOC( int, nSize * sizeof(void *) + nEntries );
    pRes = (int **)pBuffer;
    pRes[0] = pBuffer + nSize * sizeof(void *);
    nTotal = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vVec, vOne, i )
    {
        pRes[i] = pRes[0] + nTotal;
        nTotal += Vec_IntSize(vOne) + 1;
        if ( fVerbose )
        printf( "%d : ", i );
        Vec_IntForEachEntry( vOne, Value, k )
        {
            pRes[i][k] = Value;
            if ( fVerbose )
            printf( "%d(%d) ", Value&0xffff, Value>>16 );
        }
        if ( fVerbose )
        printf( "\n" );
        pRes[i][k] = 0;
    }
    assert( nTotal == nEntries );
    return pRes;
}